

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::divsMusashi<(moira::Core)0>(Moira *this,u32 op1,u32 op2)

{
  bool bVar1;
  u64 data;
  i16 remainder;
  i64 quotient;
  u32 result;
  u32 op2_local;
  u32 op1_local;
  Moira *this_local;
  
  if ((op1 == 0x80000000) && (op2 == 0xffffffff)) {
    (this->reg).sr.z = false;
    (this->reg).sr.n = false;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    quotient._4_4_ = 0;
  }
  else {
    data = (long)(int)op1 / (long)(short)op2;
    if (data == (long)(short)data) {
      quotient._4_4_ = (uint)data & 0xffff | (int)op1 % (int)(short)op2 << 0x10;
      (this->reg).sr.z = data != 0;
      bVar1 = NBIT<2>(data);
      (this->reg).sr.n = bVar1;
      (this->reg).sr.v = false;
      (this->reg).sr.c = false;
    }
    else {
      (this->reg).sr.v = true;
      quotient._4_4_ = op1;
    }
  }
  return quotient._4_4_;
}

Assistant:

u32
Moira::divsMusashi(u32 op1, u32 op2)
{
    u32 result;

    if (op1 == 0x80000000 && (i32)op2 == -1) {

        reg.sr.z = 0;
        reg.sr.n = 0;
        reg.sr.v = 0;
        reg.sr.c = 0;
        result = 0;

    } else {

        i64 quotient  = (i64)(i32)op1 / (i16)op2;
        i16 remainder = (i64)(i32)op1 % (i16)op2;

        if (quotient == (i16)quotient) {

            result = (quotient & 0xffff) | (u16)remainder << 16;

            reg.sr.z = quotient;
            reg.sr.n = NBIT<Word>(quotient);
            reg.sr.v = 0;
            reg.sr.c = 0;

        } else {

            result = op1;
            reg.sr.v = 1;
        }
    }

    return result;
}